

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall spectest::JSONParser::ParseOptNameStringValue(JSONParser *this,string *out_string)

{
  bool bVar1;
  Result RVar2;
  
  out_string->_M_string_length = 0;
  *(out_string->_M_dataplus)._M_p = '\0';
  bVar1 = Match(this,"\"name\"");
  if (bVar1) {
    RVar2 = Expect(this,":");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    RVar2 = ParseString(this,out_string);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    RVar2 = Expect(this,",");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
  }
  return (Result)Ok;
}

Assistant:

wabt::Result JSONParser::ParseOptNameStringValue(std::string* out_string) {
  out_string->clear();
  if (Match("\"name\"")) {
    EXPECT(":");
    CHECK_RESULT(ParseString(out_string));
    EXPECT(",");
  }
  return wabt::Result::Ok;
}